

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

bool test64Deserialize(string *filename)

{
  size_t __n;
  ssize_t sVar1;
  size_t __n_00;
  size_t i;
  ulong uVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  allocator_type local_2a9;
  vector<char,_std::allocator<char>_> buf1;
  vector<char,_std::allocator<char>_> buf2;
  Roaring64Map roaring;
  ifstream in;
  undefined8 auStack_138 [36];
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&roaring,
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/testdata/"
                 ,filename);
  std::ifstream::ifstream(&in,(string *)&roaring,_S_bin);
  std::__cxx11::string::~string((string *)&roaring);
  __first._8_8_ = 0xffffffffffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(_in + -0x18));
  std::vector<char,std::allocator<char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<char,std::allocator<char>> *)&buf1,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)&roaring);
  printf("Reading %lu bytes\n",
         (long)buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start);
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  roaring.roarings._M_t._M_impl._0_8_ = 0;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roaring.copyOnWrite = false;
  roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roaring.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::roaring::Roaring64Map::readSafe
            ((Roaring64Map *)&buf2,
             buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(long)buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
  ::roaring::Roaring64Map::operator=(&roaring,(Roaring64Map *)&buf2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&buf2);
  __n = ::roaring::Roaring64Map::getSizeInBytes(&roaring,true);
  std::vector<char,_std::allocator<char>_>::vector(&buf2,__n,&local_2a9);
  __n_00 = 0x80d;
  _assert_true((ulong)((long)buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start ==
                      (long)buf2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)buf2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start),"buf1.size() == buf2.size()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x80d);
  sVar1 = ::roaring::Roaring64Map::write
                    (&roaring,(int)buf2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start,(void *)0x1,__n_00);
  _assert_true((ulong)(sVar1 == (long)buf2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)buf2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start),
               "roaring.write(buf2.data()) == buf2.size()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x80e);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start); uVar2 = uVar2 + 1) {
    _assert_true((ulong)(buf1.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar2] ==
                        buf2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar2]),"buf1[i] == buf2[i]",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x810);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf2.super__Vector_base<char,_std::allocator<char>_>);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&roaring);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf1.super__Vector_base<char,_std::allocator<char>_>);
  std::ifstream::~ifstream(&in);
  return true;
}

Assistant:

bool test64Deserialize(const std::string &filename) {
#if CROARING_IS_BIG_ENDIAN
    (void)filename;
    printf("Big-endian IO unsupported.\n");
#else  // CROARING_IS_BIG_ENDIAN
    std::ifstream in(TEST_DATA_DIR + filename, std::ios::binary);
    std::vector<char> buf1(std::istreambuf_iterator<char>(in), {});
    printf("Reading %lu bytes\n", (unsigned long)buf1.size());
    Roaring64Map roaring;
#if ROARING_EXCEPTIONS
    try {
        roaring = Roaring64Map::readSafe(buf1.data(), buf1.size());
    } catch (...) {
        return false;
    }
#else   // ROARING_EXCEPTIONS
    roaring = Roaring64Map::readSafe(buf1.data(), buf1.size());
#endif  // ROARING_EXCEPTIONS
    std::vector<char> buf2(roaring.getSizeInBytes());
    assert_true(buf1.size() == buf2.size());
    assert_true(roaring.write(buf2.data()) == buf2.size());
    for (size_t i = 0; i < buf1.size(); ++i) {
        assert_true(buf1[i] == buf2[i]);
    }
#endif  // CROARING_IS_BIG_ENDIAN
    return true;
}